

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O1

REF_STATUS ref_swap_tri_pass(REF_GRID ref_grid)

{
  int *piVar1;
  REF_INT node0;
  int node1;
  int iVar2;
  REF_NODE pRVar3;
  REF_INT *pRVar4;
  uint uVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  REF_BOOL allowed;
  REF_BOOL has_edg;
  REF_BOOL has_tri;
  REF_BOOL hex_side;
  REF_BOOL pyr_side;
  REF_BOOL pri_side;
  REF_BOOL qua_side;
  REF_EDGE ref_edge;
  uint local_74;
  uint local_70;
  int local_6c;
  long local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  REF_NODE local_48;
  REF_EDGE local_40;
  long local_38;
  
  pRVar3 = ref_grid->node;
  if ((ref_grid->surf == 0) && (ref_grid->twod == 0)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x2de,
           "ref_swap_tri_pass","only twod/surf");
    local_70 = 1;
  }
  else {
    uVar5 = ref_edge_create(&local_40,ref_grid);
    if (uVar5 == 0) {
      if (0 < local_40->n) {
        lVar9 = 0;
        local_70 = 0;
        local_48 = pRVar3;
        do {
          node0 = local_40->e2n[lVar9 * 2];
          node1 = local_40->e2n[lVar9 * 2 + 1];
          uVar5 = ref_cell_has_side(ref_grid->cell[0],node0,node1,&local_6c);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x2e6,"ref_swap_tri_pass",(ulong)uVar5,"has edg");
            return uVar5;
          }
          if (local_6c == 0) {
            lVar7 = (long)node1;
            uVar5 = ref_cell_has_side(ref_grid->cell[3],node0,node1,&local_5c);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                     ,0x2ea,"ref_swap_tri_pass",(ulong)uVar5,"still triangle side");
              return uVar5;
            }
            if (local_5c != 0) {
              iVar2 = local_48->ref_mpi->id;
              if ((iVar2 == local_48->part[node0]) || (iVar2 == local_48->part[lVar7])) {
                local_38 = (long)node0;
                uVar5 = ref_cell_has_side(ref_grid->cell[6],node0,node1,&local_4c);
                local_68 = lVar7;
                if (uVar5 == 0) {
                  uVar5 = ref_cell_has_side(ref_grid->cell[10],node0,node1,&local_50);
                  if (uVar5 == 0) {
                    uVar5 = ref_cell_has_side(ref_grid->cell[9],node0,(REF_INT)local_68,&local_54);
                    if (uVar5 == 0) {
                      uVar5 = ref_cell_has_side(ref_grid->cell[0xb],node0,node1,&local_58);
                      if (uVar5 == 0) {
                        local_74 = (uint)(((local_50 == 0 && local_4c == 0) && local_54 == 0) &&
                                         local_58 == 0);
                        uVar5 = 0;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                               ,0x2d1,"ref_swap_edge_mixed",(ulong)uVar5,"hex");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                             ,0x2cf,"ref_swap_edge_mixed",(ulong)uVar5,"pyr");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                           ,0x2cd,"ref_swap_edge_mixed",(ulong)uVar5,"pri");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                         ,0x2cb,"ref_swap_edge_mixed",(ulong)uVar5,"qua");
                }
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                         ,0x2f1,"ref_swap_tri_pass",(ulong)uVar5,"faceid");
                  return uVar5;
                }
                if (local_74 != 0) {
                  uVar5 = ref_swap_same_faceid(ref_grid,node0,node1,(REF_BOOL *)&local_74);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                           ,0x2f3,"ref_swap_tri_pass",(ulong)uVar5,"faceid");
                    return uVar5;
                  }
                  if (local_74 != 0) {
                    uVar5 = ref_swap_manifold(ref_grid,node0,(REF_INT)local_68,(REF_BOOL *)&local_74
                                             );
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                             ,0x2f5,"ref_swap_tri_pass",(ulong)uVar5,"manifold");
                      return uVar5;
                    }
                    if (local_74 != 0) {
                      uVar5 = ref_swap_geom_topo(ref_grid,node0,node1,(REF_BOOL *)&local_74);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                               ,0x2f7,"ref_swap_tri_pass",(ulong)uVar5,"topo");
                        return uVar5;
                      }
                      if (local_74 != 0) {
                        uVar5 = ref_swap_quality(ref_grid,node0,(REF_INT)local_68,
                                                 (REF_BOOL *)&local_74);
                        if (uVar5 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                 ,0x2f9,"ref_swap_tri_pass",(ulong)uVar5,"qual");
                          return uVar5;
                        }
                        if (local_74 != 0) {
                          uVar5 = ref_swap_ratio(ref_grid,node0,node1,(REF_BOOL *)&local_74);
                          if (uVar5 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                   ,0x2fb,"ref_swap_tri_pass",(ulong)uVar5,"ratio");
                            return uVar5;
                          }
                          if (local_74 != 0) {
                            if (ref_grid->surf == 0) {
                              uVar5 = ref_swap_outward_norm
                                                (ref_grid,node0,node1,(REF_BOOL *)&local_74);
                              if (uVar5 != 0) {
                                uVar6 = 0x301;
                                pcVar8 = "area";
                                goto LAB_001e5e3f;
                              }
                            }
                            else {
                              uVar5 = ref_swap_conforming(ref_grid,node0,(REF_INT)local_68,
                                                          (REF_BOOL *)&local_74);
                              if (uVar5 != 0) {
                                uVar6 = 0x2fe;
                                pcVar8 = "normdev";
LAB_001e5e3f:
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                       ,uVar6,"ref_swap_tri_pass",(ulong)uVar5,pcVar8);
                                local_70 = uVar5;
                              }
                            }
                            lVar7 = local_68;
                            if (uVar5 != 0) {
                              return local_70;
                            }
                            if (local_74 != 0) {
                              ref_swap_local_cell(ref_grid,node0,(REF_INT)local_68,
                                                  (REF_BOOL *)&local_74);
                              if (local_74 == 0) {
                                pRVar4 = local_48->age;
                                piVar1 = pRVar4 + local_38;
                                *piVar1 = *piVar1 + 1;
                                piVar1 = pRVar4 + lVar7;
                                *piVar1 = *piVar1 + 1;
                              }
                              else {
                                uVar5 = ref_swap_tri_edge(ref_grid,node0,node1);
                                if (uVar5 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                         ,0x30c,"ref_swap_tri_pass",(ulong)uVar5,"swap");
                                  return uVar5;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < local_40->n);
      }
      ref_edge_free(local_40);
      local_70 = 0;
    }
    else {
      local_70 = uVar5;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x2e0,
             "ref_swap_tri_pass",(ulong)uVar5,"orig edges");
    }
  }
  return local_70;
}

Assistant:

REF_FCN REF_STATUS ref_swap_tri_pass(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge, node0, node1;
  REF_BOOL allowed, has_edg, has_tri;

  RAS(ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid), "only twod/surf");

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);

    RSS(ref_cell_has_side(ref_grid_edg(ref_grid), node0, node1, &has_edg),
        "has edg");
    if (has_edg) continue;

    RSS(ref_cell_has_side(ref_grid_tri(ref_grid), node0, node1, &has_tri),
        "still triangle side");
    if (!has_tri) continue;

    /* skip if neither node is owned */
    if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1))
      continue;

    RSS(ref_swap_edge_mixed(ref_grid, node0, node1, &allowed), "faceid");
    if (!allowed) continue;
    RSS(ref_swap_same_faceid(ref_grid, node0, node1, &allowed), "faceid");
    if (!allowed) continue;
    RSS(ref_swap_manifold(ref_grid, node0, node1, &allowed), "manifold");
    if (!allowed) continue;
    RSS(ref_swap_geom_topo(ref_grid, node0, node1, &allowed), "topo");
    if (!allowed) continue;
    RSS(ref_swap_quality(ref_grid, node0, node1, &allowed), "qual");
    if (!allowed) continue;
    RSS(ref_swap_ratio(ref_grid, node0, node1, &allowed), "ratio");
    if (!allowed) continue;
    if (ref_grid_surf(ref_grid)) {
      RSS(ref_swap_conforming(ref_grid, node0, node1, &allowed), "normdev");
      if (!allowed) continue;
    } else {
      RSS(ref_swap_outward_norm(ref_grid, node0, node1, &allowed), "area");
      if (!allowed) continue;
    }

    RSS(ref_swap_local_cell(ref_grid, node0, node1, &allowed), "local");
    if (!allowed) {
      ref_node_age(ref_node, node0)++;
      ref_node_age(ref_node, node1)++;
      continue;
    }

    RSS(ref_swap_tri_edge(ref_grid, node0, node1), "swap");
  }

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}